

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::removeSceneEventFilter
          (QGraphicsScenePrivate *this,QGraphicsItem *watched,QGraphicsItem *filter)

{
  long lVar1;
  bool bVar2;
  QGraphicsItem **ppQVar3;
  QGraphicsItem *in_RDX;
  QMultiMap<QGraphicsItem_*,_QGraphicsItem_*> *in_RDI;
  long in_FS_OFFSET;
  Iterator end;
  Iterator it;
  iterator *in_stack_ffffffffffffffa8;
  QMultiMap<QGraphicsItem_*,_QGraphicsItem_*> *in_stack_ffffffffffffffb0;
  QMultiMap<QGraphicsItem_*,_QGraphicsItem_*> *this_00;
  const_iterator in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = QMultiMap<QGraphicsItem_*,_QGraphicsItem_*>::contains
                    ((QMultiMap<QGraphicsItem_*,_QGraphicsItem_*> *)in_RDX,(QGraphicsItem **)in_RDI)
  ;
  if (bVar2) {
    QMultiMap<QGraphicsItem_*,_QGraphicsItem_*>::lowerBound(this_00,(QGraphicsItem **)in_RDX);
    QMultiMap<QGraphicsItem_*,_QGraphicsItem_*>::upperBound(this_00,(QGraphicsItem **)in_RDX);
    do {
      ppQVar3 = QMultiMap<QGraphicsItem_*,_QGraphicsItem_*>::iterator::value((iterator *)0x9c7381);
      if (*ppQVar3 == in_RDX) {
        in_stack_ffffffffffffffb0 = in_RDI + 0x53;
        QMultiMap<QGraphicsItem_*,_QGraphicsItem_*>::const_iterator::const_iterator
                  ((const_iterator *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        in_stack_ffffffffffffffd8._M_node =
             (_Base_ptr)
             QMultiMap<QGraphicsItem_*,_QGraphicsItem_*>::erase
                       (in_RDI,in_stack_ffffffffffffffd8._M_node);
      }
      else {
        QMultiMap<QGraphicsItem_*,_QGraphicsItem_*>::iterator::operator++
                  ((iterator *)in_stack_ffffffffffffffb0);
      }
      bVar2 = ::operator!=((iterator *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    } while (bVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::removeSceneEventFilter(QGraphicsItem *watched, QGraphicsItem *filter)
{
    if (!sceneEventFilters.contains(watched))
        return;

    QMultiMap<QGraphicsItem *, QGraphicsItem *>::Iterator it = sceneEventFilters.lowerBound(watched);
    QMultiMap<QGraphicsItem *, QGraphicsItem *>::Iterator end = sceneEventFilters.upperBound(watched);
    do {
        if (it.value() == filter)
            it = sceneEventFilters.erase(it);
        else
            ++it;
    } while (it != end);
}